

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_embedded_oneof(CTcEmbedBuilder *b,int *eos,CTcEmbedLevel *parent)

{
  CTcEmbedTokenList *tl;
  long lVar1;
  int iVar2;
  CTPNListBase *this;
  CTcPrsNode *pCVar3;
  long lVar4;
  char *attrs;
  CTcEmbedLevel level;
  
  tl = G_prs->embed_toks_;
  level.typ = 2;
  level.parent = parent;
  this = (CTPNListBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x50,(size_t)eos);
  (this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
  *(undefined8 *)&this->cnt_ = 0;
  this->head_ = (CTPNListEle *)0x0;
  this->tail_ = (CTPNListEle *)0x0;
  *(undefined8 *)&this->const_val_ = 0;
  (this->const_val_).val_.intval_ = 0;
  (this->const_val_).val_.floatval_.len_ = 0;
  *(undefined8 *)((long)&(this->const_val_).val_ + 0x10) = 0;
  *(undefined8 *)&(this->const_val_).field_0x20 = 0;
  *(undefined8 *)&this->field_0x48 = 0;
  CTPNList::CTPNList((CTPNList *)this);
  do {
    pCVar3 = parse_embedding_list(b,eos,&level);
    if (pCVar3 == (CTcPrsNode *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    CTPNListBase::add_element(this,pCVar3);
    tl->wrt = tl->head;
    tl->cnt = 0;
    capture_embedded(b,tl);
    iVar2 = CTcEmbedTokenList::match(tl,"or");
  } while ((iVar2 != 0) || (iVar2 = CTcEmbedTokenList::match(tl,"||"), iVar2 != 0));
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (lVar4 + 0x10 == 0xd0) goto LAB_001fc45c;
    iVar2 = CTcEmbedTokenList::match(tl,*(char **)((long)&one_of_list[0].endph + lVar4));
    lVar1 = lVar4 + 0x10;
  } while (iVar2 == 0);
  attrs = *(char **)((long)&one_of_list[0].attr + lVar4);
  if (attrs == (char *)0x0) {
LAB_001fc45c:
    CTcEmbedTokenList::unget(tl,0,0);
    attrs = "rand";
  }
  pCVar3 = create_oneof_node(b,(CTPNList *)this,attrs);
  return pCVar3;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_oneof(
    CTcEmbedBuilder *b, int &eos, CTcEmbedLevel *parent)
{
    /* get the embedding token list capturer */
    CTcEmbedTokenList *tl = G_prs->embed_toks_;

    /* set up our stack level */
    CTcEmbedLevel level(CTcEmbedLevel::OneOf, parent);

    /* create a list node to hold the items */
    CTPNList *lst = new CTPNList();

    /* keep going until we get to the end of the list */
    for (;;)
    {
        /* parse the next string or embedded expression */
        CTcPrsNode *ele = parse_embedding_list(b, eos, &level);
        if (ele == 0)
            return 0;

        /* add this element to the list */
        lst->add_element(ele);

        /* capture the ending token list */
        tl->reset();
        capture_embedded(b, tl);

        /* if we're not at an OR, this is the end of the list */
        if (!tl->match("or") && !tl->match("||"))
            break;
    }

    /* 
     *   Search for a match to one of our endings.  If we don't find one, use
     *   "purely at random" as the default. 
     */
    const char *attrs = 0;
    for (size_t i = 0 ; i < countof(one_of_list) ; ++i)
    {
        /* check for a match */
        if (tl->match(one_of_list[i].endph))
        {
            /* got it - set this attribute and stop searching */
            attrs = one_of_list[i].attr;
            break;
        }
    }

    /* 
     *   if we didn't find a match for the ending tokens, we must have the
     *   ending for an enclosing structure; put the tokens back for the
     *   enclosing structure to parse, and use "purely at random" as the
     *   default 
     */
    if (attrs == 0)
    {
        tl->unget();
        attrs = "rand";
    }

    /* create the one-of list */
    return create_oneof_node(b, lst, attrs);
}